

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

double __thiscall
HEkkPrimal::computePrimalSteepestEdgeWeight(HEkkPrimal *this,HighsInt iVar,HVector *param_2)

{
  HEkk *pHVar1;
  double dVar2;
  
  HVectorBase<double>::clear(param_2);
  HighsSparseMatrix::collectAj(&(this->ekk_instance_->lp_).a_matrix_,param_2,iVar,1.0);
  param_2->packFlag = false;
  pHVar1 = this->ekk_instance_;
  HSimplexNla::ftran(&pHVar1->simplex_nla_,param_2,(pHVar1->info_).col_aq_density,
                     (pHVar1->analysis_).pointer_serial_factor_clocks);
  pHVar1 = this->ekk_instance_;
  HEkk::updateOperationResultDensity
            (pHVar1,(double)param_2->count / (double)(pHVar1->lp_).num_row_,
             &(pHVar1->info_).col_aq_density);
  dVar2 = HVectorBase<double>::norm2(param_2);
  return dVar2 + 1.0;
}

Assistant:

double HEkkPrimal::computePrimalSteepestEdgeWeight(const HighsInt iVar,
                                                   HVector& local_col_aq) {
  local_col_aq.clear();
  ekk_instance_.lp_.a_matrix_.collectAj(local_col_aq, iVar, 1);
  local_col_aq.packFlag = false;
  ekk_instance_.simplex_nla_.ftran(
      local_col_aq, ekk_instance_.info_.col_aq_density,
      ekk_instance_.analysis_.pointer_serial_factor_clocks);
  const double local_col_aq_density =
      (1.0 * local_col_aq.count) / ekk_instance_.lp_.num_row_;
  ekk_instance_.updateOperationResultDensity(
      local_col_aq_density, ekk_instance_.info_.col_aq_density);
  return 1 + local_col_aq.norm2();
}